

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_tf_mt_dealloc(AV1TemporalFilterSync *tf_sync)

{
  if (tf_sync->mutex_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)tf_sync->mutex_);
    aom_free(tf_sync->mutex_);
  }
  tf_sync->next_tf_row = 0;
  return;
}

Assistant:

void av1_tf_mt_dealloc(AV1TemporalFilterSync *tf_sync) {
  assert(tf_sync != NULL);
#if CONFIG_MULTITHREAD
  if (tf_sync->mutex_ != NULL) {
    pthread_mutex_destroy(tf_sync->mutex_);
    aom_free(tf_sync->mutex_);
  }
#endif  // CONFIG_MULTITHREAD
  tf_sync->next_tf_row = 0;
}